

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_json.c
# Opt level: O1

FIOBJ fiobj_obj2json2(FIOBJ dest,FIOBJ o,uint8_t pretty)

{
  undefined1 uVar1;
  uint uVar2;
  fiobj_object_vtable_s *pfVar3;
  obj2json_data_s data;
  fio_json_stack_s stack;
  FIOBJ local_50 [2];
  undefined8 *local_40;
  undefined8 local_38;
  uint8_t local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  void *pvStack_10;
  
  if (((uint)dest & 7) != 2) {
    __assert_fail("dest && FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_json.c"
                  ,0x1a3,"FIOBJ fiobj_obj2json2(FIOBJ, FIOBJ, uint8_t)");
  }
  if (o == 0) {
    fiobj_str_write(dest,anon_var_dwarf_20f,4);
    dest = 0;
  }
  else {
    local_40 = &local_28;
    local_18 = 0;
    pvStack_10 = (void *)0x0;
    local_28 = 0;
    uStack_20 = 0;
    local_50[1] = 0;
    local_38 = 1;
    uVar2 = (uint)o & 6;
    local_50[0] = dest;
    local_30 = pretty;
    if (uVar2 != 6 && (o & 1) == 0) {
      switch(uVar2) {
      case 0:
        uVar1 = *(undefined1 *)(o & 0xfffffffffffffff8);
        break;
      case 2:
        uVar1 = 0x28;
        break;
      case 4:
        uVar1 = 0x2a;
        break;
      case 6:
        uVar1 = (undefined1)o;
      }
      switch(uVar1) {
      case 0x27:
        pfVar3 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case 0x28:
        pfVar3 = &FIOBJECT_VTABLE_STRING;
        break;
      case 0x29:
        pfVar3 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case 0x2a:
        pfVar3 = &FIOBJECT_VTABLE_HASH;
        break;
      case 0x2b:
        pfVar3 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar3 = &FIOBJECT_VTABLE_NUMBER;
      }
      if (pfVar3->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0) {
        fiobj_each2(o,fiobj_obj2json_task,local_50);
        fio_free(pvStack_10);
        return dest;
      }
    }
    fiobj_obj2json_task(o,local_50);
  }
  return dest;
}

Assistant:

FIOBJ fiobj_obj2json2(FIOBJ dest, FIOBJ o, uint8_t pretty) {
  assert(dest && FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (!o) {
    fiobj_str_write(dest, "null", 4);
    return 0;
  }
  fio_json_stack_s stack = FIO_ARY_INIT;
  obj2json_data_s data = {
      .dest = dest,
      .stack = &stack,
      .pretty = pretty,
      .count = 1,
  };
  if (!o || !FIOBJ_IS_ALLOCATED(o) || !FIOBJECT2VTBL(o)->each) {
    fiobj_obj2json_task(o, &data);
    return dest;
  }
  fiobj_each2(o, fiobj_obj2json_task, &data);
  fio_json_stack_free(&stack);
  return dest;
}